

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

QJsonValueRef * assignToRef(QJsonValueRef *ref,QCborValue *value,bool is_object)

{
  QCborContainerPrivate *this;
  undefined7 in_register_00000011;
  ulong uVar1;
  
  this = (ref->super_QJsonValueConstRef).d;
  uVar1 = *(ulong *)&(ref->super_QJsonValueConstRef).field_0x8;
  uVar1 = uVar1 >> (~(byte)uVar1 & 1);
  if (((int)CONCAT71(in_register_00000011,is_object) == 0) || (value->t != Undefined)) {
    QCborContainerPrivate::replaceAt(this,uVar1,value,CopyContainer);
  }
  else {
    QCborContainerPrivate::removeAt(this,uVar1);
    QCborContainerPrivate::removeAt(this,uVar1 - 1);
  }
  return ref;
}

Assistant:

static QJsonValueRef &assignToRef(QJsonValueRef &ref, const QCborValue &value, bool is_object)
{
    QCborContainerPrivate *d = QJsonPrivate::Value::container(ref);
    qsizetype index = QJsonPrivate::Value::indexHelper(ref);
    if (is_object && value.isUndefined()) {
        d->removeAt(index);
        d->removeAt(index - 1);
    } else {
        d->replaceAt(index, value);
    }

    return ref;
}